

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O0

long __thiscall PrimeExtractor::findNextStep(PrimeExtractor *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference local_30;
  ulong local_20;
  long i;
  PrimeExtractor *this_local;
  
  local_20 = this->lastStep;
  i = (long)this;
  do {
    local_20 = local_20 + 1;
    uVar1 = local_20;
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&this->primeCand);
    if (sVar3 <= uVar1) {
      return 0;
    }
    local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,local_20);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_30);
  } while (!bVar2);
  this->lastStep = local_20;
  return local_20 * 2 + 1;
}

Assistant:

long PrimeExtractor::findNextStep()
{
  for (long i = this->lastStep +1; i < this->primeCand.size(); i++) {
    if (this->primeCand[i] == true) {
      this->lastStep = i;
      return i*2+1 ;
    } 
  }
  return 0;
}